

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86_avx512::create_pipeline_int8_x86(Convolution_x86_avx512 *this,Option *opt)

{
  float fVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  uint uVar14;
  _func_int *p_Var15;
  size_t sVar16;
  Allocator *pAVar17;
  _func_int **pp_Var18;
  int *piVar19;
  size_t sVar20;
  undefined1 auVar21 [16];
  undefined8 uVar22;
  undefined8 uVar23;
  uint num_input;
  ulong uVar24;
  ulong uVar25;
  void *pvVar26;
  ulong uVar27;
  long lVar28;
  void *pvVar29;
  ulong uVar30;
  void *pvVar31;
  byte bVar32;
  int j;
  uint uVar33;
  undefined4 uVar34;
  void *pvVar35;
  undefined2 *puVar36;
  void *pvVar37;
  uint uVar38;
  void *pvVar39;
  void *pvVar40;
  void *pvVar41;
  int k;
  int iVar42;
  long lVar43;
  void *pvVar44;
  void *pvVar45;
  int i;
  int iVar46;
  int iVar47;
  uint *puVar48;
  undefined2 *puVar49;
  int i_2;
  long lVar50;
  void *pvVar51;
  void *pvVar52;
  int k_2;
  ulong uVar53;
  void *pvVar54;
  int p;
  int p_1;
  long lVar55;
  long lVar56;
  undefined2 *puVar57;
  undefined2 *puVar58;
  bool bVar59;
  byte bVar60;
  float fVar61;
  undefined8 local_c0;
  undefined1 local_b8 [64];
  size_t local_78;
  long local_68;
  uint local_60;
  undefined4 local_5c;
  short sStack_58;
  uint auStack_56 [9];
  
  p_Var15 = this->_vptr_Convolution_x86_avx512[-3];
  iVar42 = *(int *)(p_Var15 + 0x34 + (long)&(this->weight_winograd23_data).data);
  iVar46 = *(int *)(p_Var15 + 0x38 + (long)&(this->weight_winograd23_data).data);
  uVar30 = (long)*(int *)(p_Var15 + 0x1c + (long)&(this->weight_winograd43_data).data) /
           (long)(iVar46 * iVar42);
  uVar14 = *(uint *)(p_Var15 + 0x30 + (long)&(this->weight_winograd23_data).data);
  uVar30 = (long)((ulong)(uint)((int)uVar30 >> 0x1f) << 0x20 | uVar30 & 0xffffffff) /
           (long)(int)uVar14;
  uVar24 = uVar30 & 0xffffffff;
  bVar32 = opt->use_packing_layout;
  num_input = (uint)uVar30;
  local_c0 = (void *)(long)(int)num_input;
  if ((bool)bVar32 == true) {
    bVar59 = (uVar30 & 7) == 0;
    uVar38 = uVar14 & 3;
    bVar60 = uVar38 != 0;
    uVar33 = num_input & 7;
    if ((uVar30 & 7) == 0 && uVar38 == 0) {
      if (((iVar46 == 1 && iVar42 == 1) &&
          (*(int *)(p_Var15 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
         (((*(int *)(p_Var15 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
           ((*(int *)(p_Var15 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
            (*(int *)(p_Var15 + (long)&(this->weight_winograd43_data).data) == 1)))) ||
          ((*(int *)(p_Var15 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
           ((*(int *)(p_Var15 + 0x44 + (long)&(this->weight_winograd23_data).data) == 2 &&
            (*(int *)(p_Var15 + (long)&(this->weight_winograd43_data).data) == 2)))))))) {
        iVar42 = 1;
        iVar46 = iVar42;
      }
      else {
        if ((((opt->use_winograd_convolution == true) &&
             (((iVar46 == 3 && (iVar42 == 3)) && (opt->use_winograd43_convolution != false)))) &&
            (((*(int *)(p_Var15 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
              (*(int *)(p_Var15 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
             (*(int *)(p_Var15 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1)))) &&
           (*(int *)(p_Var15 + (long)&(this->weight_winograd43_data).data) == 1)) {
          local_78 = 0;
          local_b8._0_8_ = (void *)0x0;
          local_b8._8_4_ = 0;
          local_b8._12_4_ = 0;
          local_b8._16_8_ = 0;
          local_b8._24_4_ = 0;
          local_b8._32_8_ = (Allocator *)0x0;
          local_b8._40_4_ = 0;
          local_b8._44_4_ = 0;
          local_b8._48_12_ = SUB1612((undefined1  [16])0x0,4);
          uVar53 = 0;
          local_60 = uVar38;
          local_5c = num_input & 7;
          Mat::create((Mat *)local_b8,0x24,num_input,uVar14,2,(Allocator *)0x0);
          uVar30 = 0;
          if (0 < (int)num_input) {
            uVar30 = uVar24;
          }
          uVar25 = 0;
          if (0 < (int)uVar14) {
            uVar25 = (ulong)uVar14;
          }
          for (; uVar53 != uVar25; uVar53 = uVar53 + 1) {
            lVar55 = (long)(int)(num_input * 9 * (int)uVar53) +
                     *(long *)(p_Var15 + 0x30 + (long)&(this->weight_winograd63_data).data);
            pvVar29 = (void *)(local_b8._16_8_ * local_78 * uVar53 + local_b8._0_8_);
            for (uVar27 = 0; uVar27 != uVar30; uVar27 = uVar27 + 1) {
              lVar28 = uVar27 * 9;
              cVar2 = *(char *)(lVar55 + lVar28);
              cVar3 = *(char *)(lVar55 + 1 + lVar28);
              cVar4 = *(char *)(lVar55 + 2 + lVar28);
              cVar5 = *(char *)(lVar55 + 3 + lVar28);
              cVar6 = *(char *)(lVar55 + 4 + lVar28);
              cVar7 = *(char *)(lVar55 + 5 + lVar28);
              cVar8 = *(char *)(lVar55 + 6 + lVar28);
              cVar9 = *(char *)(lVar55 + 7 + lVar28);
              cVar10 = *(char *)(lVar55 + 8 + lVar28);
              for (lVar28 = 4; lVar28 != 0x28; lVar28 = lVar28 + 6) {
                sVar11 = *(short *)((long)_ps512_cephes_log_q2 + lVar28 + 0x3c);
                sVar12 = *(short *)((long)_ps512_cephes_log_q2 + lVar28 + 0x3e);
                sVar13 = *(short *)((long)&DAT_004c7240 + lVar28);
                *(short *)((long)&local_5c + lVar28) =
                     sVar13 * cVar4 + sVar12 * cVar3 + sVar11 * cVar2;
                *(short *)((long)&local_5c + lVar28 + 2) =
                     sVar13 * cVar7 + sVar12 * cVar6 + sVar11 * cVar5;
                *(short *)((long)auStack_56 + lVar28 + -2) =
                     sVar13 * cVar10 + sVar12 * cVar9 + sVar11 * cVar8;
              }
              pvVar26 = pvVar29;
              for (lVar28 = 0; lVar28 != 6; lVar28 = lVar28 + 1) {
                sVar11 = *(short *)((long)auStack_56 + lVar28 * 6 + -2);
                uVar33 = *(uint *)((long)auStack_56 + lVar28 * 6);
                puVar48 = &DAT_004c7242;
                for (lVar43 = 0; lVar43 != 6; lVar43 = lVar43 + 1) {
                  auVar21 = vpmullw_avx(ZEXT416(*puVar48),ZEXT416(uVar33));
                  uVar34 = vpextrw_avx(auVar21,1);
                  *(short *)((long)pvVar26 + lVar43 * 2) =
                       (short)uVar34 + auVar21._0_2_ + *(short *)((long)puVar48 + -2) * sVar11;
                  puVar48 = (uint *)((long)puVar48 + 6);
                }
                pvVar26 = (void *)((long)pvVar26 + 0xc);
              }
              pvVar29 = (void *)((long)pvVar29 + (long)(int)local_b8._44_4_ * local_b8._16_8_);
            }
          }
          Mat::create(&this->weight_winograd43_data,
                      (int)((long)((ulong)(uint)((int)num_input >> 0x1f) << 0x20 | uVar24) / 8),0x24
                      ,(int)uVar14 / 4,0x40,0x20,(Allocator *)0x0);
          lVar28 = local_78 * local_b8._16_8_;
          iVar42 = (this->weight_winograd43_data).w;
          pvVar26 = (this->weight_winograd43_data).data;
          sVar16 = (this->weight_winograd43_data).elemsize;
          sVar20 = (this->weight_winograd43_data).cstep;
          pvVar44 = (void *)(lVar28 * 3 + local_b8._0_8_);
          local_68 = lVar28 * 4;
          lVar55 = (long)(int)local_b8._44_4_ * local_b8._16_8_ * 8;
          pvVar29 = (void *)(local_b8._0_8_ + lVar28 * 2);
          pvVar41 = (void *)(lVar28 + local_b8._0_8_);
          pvVar40 = (void *)local_b8._0_8_;
          for (uVar30 = 0; (long)(uVar30 | 3) < (long)(int)uVar14; uVar30 = uVar30 + 4) {
            pvVar31 = pvVar40;
            pvVar39 = pvVar41;
            pvVar45 = pvVar44;
            pvVar52 = pvVar29;
            for (lVar28 = 0; lVar28 != 0x24; lVar28 = lVar28 + 1) {
              lVar43 = (long)pvVar26 +
                       (long)iVar42 * sVar16 * lVar28 + (uVar30 >> 2) * sVar20 * sVar16;
              pvVar35 = pvVar31;
              pvVar37 = pvVar39;
              pvVar51 = pvVar45;
              pvVar54 = pvVar52;
              for (uVar53 = 0; (long)(uVar53 | 7) < (long)local_c0; uVar53 = uVar53 + 8) {
                lVar50 = 0;
                for (lVar56 = 0; lVar56 != 0x40; lVar56 = lVar56 + 8) {
                  *(undefined2 *)(lVar43 + lVar56) = *(undefined2 *)((long)pvVar35 + lVar50);
                  *(undefined2 *)(lVar43 + lVar56 + 2) = *(undefined2 *)((long)pvVar37 + lVar50);
                  *(undefined2 *)(lVar43 + lVar56 + 4) = *(undefined2 *)((long)pvVar54 + lVar50);
                  *(undefined2 *)(lVar43 + lVar56 + 6) = *(undefined2 *)((long)pvVar51 + lVar50);
                  lVar50 = lVar50 + (long)(int)local_b8._44_4_ * local_b8._16_8_;
                }
                pvVar51 = (void *)((long)pvVar51 + lVar55);
                pvVar54 = (void *)((long)pvVar54 + lVar55);
                pvVar37 = (void *)((long)pvVar37 + lVar55);
                pvVar35 = (void *)((long)pvVar35 + lVar55);
                lVar43 = lVar43 + 0x40;
              }
              pvVar45 = (void *)((long)pvVar45 + 2);
              pvVar52 = (void *)((long)pvVar52 + 2);
              pvVar39 = (void *)((long)pvVar39 + 2);
              pvVar31 = (void *)((long)pvVar31 + 2);
            }
            pvVar44 = (void *)((long)pvVar44 + local_68);
            pvVar29 = (void *)((long)pvVar29 + local_68);
            pvVar41 = (void *)((long)pvVar41 + local_68);
            pvVar40 = (void *)((long)pvVar40 + local_68);
          }
          piVar19 = (int *)CONCAT44(local_b8._12_4_,local_b8._8_4_);
          uVar33 = local_5c;
          uVar38 = local_60;
          if (piVar19 != (int *)0x0) {
            LOCK();
            *piVar19 = *piVar19 + -1;
            UNLOCK();
            if (*piVar19 == 0) {
              if ((Allocator *)local_b8._32_8_ == (Allocator *)0x0) {
                free((void *)local_b8._0_8_);
                uVar33 = local_5c;
                uVar38 = local_60;
              }
              else {
                (*(*(_func_int ***)local_b8._32_8_)[3])();
                uVar33 = local_5c;
                uVar38 = local_60;
              }
            }
          }
          goto LAB_001b1435;
        }
        if (opt->use_sgemm_convolution != true) {
          convolution_transform_kernel_packed_int8_sse
                    ((Mat *)(p_Var15 + 0x30 + (long)&(this->weight_winograd63_data).data),
                     &this->weight_data_tm,num_input,uVar14,iVar42,iVar46,8,4);
          goto LAB_001b18ce;
        }
      }
      convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse
                ((Mat *)(p_Var15 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_sgemm_data,num_input,uVar14,iVar42,iVar46);
      goto LAB_001b18ce;
    }
LAB_001b1435:
    bVar32 = bVar59;
    if ((uVar38 == 0) && (uVar33 != 0)) {
      p_Var15 = this->_vptr_Convolution_x86_avx512[-3];
      iVar42 = *(int *)(p_Var15 + 0x34 + (long)&(this->weight_winograd23_data).data);
      if (iVar42 == 7) {
        if ((((*(int *)(p_Var15 + 0x38 + (long)&(this->weight_winograd23_data).data) != 7) ||
             (*(int *)(p_Var15 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1)) ||
            (*(int *)(p_Var15 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1)) ||
           ((*(int *)(p_Var15 + 0x44 + (long)&(this->weight_winograd23_data).data) != 2 ||
            (*(int *)(p_Var15 + (long)&(this->weight_winograd43_data).data) != 2))))
        goto LAB_001b2145;
        iVar46 = *(int *)(p_Var15 + 0x30 + (long)&(this->weight_winograd23_data).data);
        iVar42 = 7;
        iVar47 = iVar42;
      }
      else if (iVar42 == 3) {
        if ((*(int *)(p_Var15 + 0x38 + (long)&(this->weight_winograd23_data).data) != 3) ||
           ((((*(int *)(p_Var15 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1 ||
              (*(int *)(p_Var15 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1)) ||
             ((*(int *)(p_Var15 + 0x44 + (long)&(this->weight_winograd23_data).data) != 1 ||
              (*(int *)(p_Var15 + (long)&(this->weight_winograd43_data).data) != 1)))) &&
            ((((*(int *)(p_Var15 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1 ||
               (*(int *)(p_Var15 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1)) ||
              (*(int *)(p_Var15 + 0x44 + (long)&(this->weight_winograd23_data).data) != 2)) ||
             (*(int *)(p_Var15 + (long)&(this->weight_winograd43_data).data) != 2))))))
        goto LAB_001b2145;
        iVar46 = *(int *)(p_Var15 + 0x30 + (long)&(this->weight_winograd23_data).data);
        iVar42 = 3;
        iVar47 = iVar42;
      }
      else if (((iVar42 == 1) &&
               (*(int *)(p_Var15 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)) &&
              ((((*(int *)(p_Var15 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
                 ((*(int *)(p_Var15 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
                  (*(int *)(p_Var15 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1)))) &&
                (*(int *)(p_Var15 + (long)&(this->weight_winograd43_data).data) == 1)) ||
               ((((*(int *)(p_Var15 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
                  (*(int *)(p_Var15 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
                 (*(int *)(p_Var15 + 0x44 + (long)&(this->weight_winograd23_data).data) == 2)) &&
                (*(int *)(p_Var15 + (long)&(this->weight_winograd43_data).data) == 2)))))) {
        iVar46 = *(int *)(p_Var15 + 0x30 + (long)&(this->weight_winograd23_data).data);
        iVar42 = 1;
        iVar47 = iVar42;
      }
      else {
LAB_001b2145:
        iVar46 = *(int *)(p_Var15 + 0x30 + (long)&(this->weight_winograd23_data).data);
        iVar47 = *(int *)(p_Var15 + 0x38 + (long)&(this->weight_winograd23_data).data);
        if (opt->use_sgemm_convolution != true) {
          convolution_transform_kernel_packed_int8_sse
                    ((Mat *)(p_Var15 + 0x30 + (long)&(this->weight_winograd63_data).data),
                     &this->weight_data_tm,num_input,iVar46,iVar42,iVar47,1,4);
          goto LAB_001b2200;
        }
      }
      convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse
                ((Mat *)(p_Var15 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_sgemm_data,num_input,iVar46,iVar42,iVar47);
      goto LAB_001b2200;
    }
  }
  else {
    bVar59 = false;
LAB_001b18ce:
    bVar60 = bVar32 ^ 1;
  }
  if ((bVar60 != 0) && (bVar59)) {
    p_Var15 = this->_vptr_Convolution_x86_avx512[-3];
    iVar42 = *(int *)(p_Var15 + 0x34 + (long)&(this->weight_winograd23_data).data);
    if (((iVar42 == 1) &&
        (*(int *)(p_Var15 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)) &&
       (((((*(int *)(p_Var15 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var15 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
          (*(int *)(p_Var15 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1)) &&
         (*(int *)(p_Var15 + (long)&(this->weight_winograd43_data).data) == 1)) ||
        ((((*(int *)(p_Var15 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var15 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
          (*(int *)(p_Var15 + 0x44 + (long)&(this->weight_winograd23_data).data) == 2)) &&
         (*(int *)(p_Var15 + (long)&(this->weight_winograd43_data).data) == 2)))))) {
      convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse
                ((Mat *)(p_Var15 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_sgemm_data,num_input,
                 *(int *)(p_Var15 + 0x30 + (long)&(this->weight_winograd23_data).data),1,1);
    }
    else if ((((opt->use_winograd_convolution == true) && (iVar42 == 3)) &&
             ((opt->use_winograd43_convolution != false &&
              ((*(int *)(p_Var15 + 0x38 + (long)&(this->weight_winograd23_data).data) == 3 &&
               (*(int *)(p_Var15 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)))))) &&
            ((*(int *)(p_Var15 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
             ((*(int *)(p_Var15 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
              (*(int *)(p_Var15 + (long)&(this->weight_winograd43_data).data) == 1)))))) {
      uVar14 = *(uint *)(p_Var15 + 0x30 + (long)&(this->weight_winograd23_data).data);
      local_78 = 0;
      local_b8._0_8_ = (void *)0x0;
      local_b8._8_4_ = 0;
      local_b8._12_4_ = 0;
      local_b8._16_8_ = 0;
      local_b8._24_4_ = 0;
      local_b8._32_8_ = (Allocator *)0x0;
      local_b8._40_4_ = 0;
      local_b8._44_4_ = 0;
      local_b8._48_12_ = SUB1612((undefined1  [16])0x0,4);
      uVar53 = 0;
      Mat::create((Mat *)local_b8,0x24,num_input,uVar14,2,(Allocator *)0x0);
      uVar30 = 0;
      if (0 < (int)num_input) {
        uVar30 = uVar24;
      }
      uVar25 = 0;
      if (0 < (int)uVar14) {
        uVar25 = (ulong)uVar14;
      }
      for (; uVar53 != uVar25; uVar53 = uVar53 + 1) {
        lVar55 = (long)(int)(num_input * 9 * (int)uVar53) +
                 *(long *)(p_Var15 + 0x30 + (long)&(this->weight_winograd63_data).data);
        pvVar29 = (void *)(local_b8._16_8_ * local_78 * uVar53 + local_b8._0_8_);
        for (uVar27 = 0; uVar27 != uVar30; uVar27 = uVar27 + 1) {
          lVar28 = uVar27 * 9;
          cVar2 = *(char *)(lVar55 + lVar28);
          cVar3 = *(char *)(lVar55 + 1 + lVar28);
          cVar4 = *(char *)(lVar55 + 2 + lVar28);
          cVar5 = *(char *)(lVar55 + 3 + lVar28);
          cVar6 = *(char *)(lVar55 + 4 + lVar28);
          cVar7 = *(char *)(lVar55 + 5 + lVar28);
          cVar8 = *(char *)(lVar55 + 6 + lVar28);
          cVar9 = *(char *)(lVar55 + 7 + lVar28);
          cVar10 = *(char *)(lVar55 + 8 + lVar28);
          for (lVar28 = 4; lVar28 != 0x28; lVar28 = lVar28 + 6) {
            sVar11 = *(short *)((long)_ps512_cephes_log_q2 + lVar28 + 0x3c);
            sVar12 = *(short *)((long)_ps512_cephes_log_q2 + lVar28 + 0x3e);
            sVar13 = *(short *)((long)&DAT_004c7240 + lVar28);
            *(short *)((long)&local_5c + lVar28) = sVar13 * cVar4 + sVar12 * cVar3 + sVar11 * cVar2;
            *(short *)((long)&local_5c + lVar28 + 2) =
                 sVar13 * cVar7 + sVar12 * cVar6 + sVar11 * cVar5;
            *(short *)((long)auStack_56 + lVar28 + -2) =
                 sVar13 * cVar10 + sVar12 * cVar9 + sVar11 * cVar8;
          }
          pvVar26 = pvVar29;
          for (lVar28 = 0; lVar28 != 6; lVar28 = lVar28 + 1) {
            sVar11 = *(short *)((long)auStack_56 + lVar28 * 6 + -2);
            uVar33 = *(uint *)((long)auStack_56 + lVar28 * 6);
            puVar48 = &DAT_004c7242;
            for (lVar43 = 0; lVar43 != 6; lVar43 = lVar43 + 1) {
              auVar21 = vpmullw_avx(ZEXT416(*puVar48),ZEXT416(uVar33));
              uVar34 = vpextrw_avx(auVar21,1);
              *(short *)((long)pvVar26 + lVar43 * 2) =
                   (short)uVar34 + auVar21._0_2_ + *(short *)((long)puVar48 + -2) * sVar11;
              puVar48 = (uint *)((long)puVar48 + 6);
            }
            pvVar26 = (void *)((long)pvVar26 + 0xc);
          }
          pvVar29 = (void *)((long)pvVar29 + (long)(int)local_b8._44_4_ * local_b8._16_8_);
        }
      }
      Mat::create(&this->weight_winograd43_data,num_input,0x24,((int)uVar14 / 4) * -3 + uVar14,8,4,
                  (Allocator *)0x0);
      lVar28 = local_78 * local_b8._16_8_;
      iVar42 = (this->weight_winograd43_data).w;
      pvVar26 = (this->weight_winograd43_data).data;
      sVar16 = (this->weight_winograd43_data).elemsize;
      sVar20 = (this->weight_winograd43_data).cstep;
      pvVar44 = (void *)(lVar28 * 3 + local_b8._0_8_);
      local_68 = lVar28 * 4;
      lVar55 = (long)(int)local_b8._44_4_ * local_b8._16_8_ * 8;
      pvVar29 = (void *)(local_b8._0_8_ + lVar28 * 2);
      pvVar41 = (void *)(lVar28 + local_b8._0_8_);
      pvVar40 = (void *)local_b8._0_8_;
      for (uVar30 = 0; (long)(uVar30 | 3) < (long)(int)uVar14; uVar30 = uVar30 + 4) {
        pvVar31 = pvVar29;
        pvVar39 = pvVar41;
        pvVar45 = pvVar44;
        pvVar52 = pvVar40;
        for (lVar28 = 0; lVar28 != 0x24; lVar28 = lVar28 + 1) {
          lVar43 = (long)pvVar26 + (long)iVar42 * sVar16 * lVar28 + (uVar30 >> 2) * sVar20 * sVar16;
          pvVar35 = pvVar52;
          pvVar37 = pvVar39;
          pvVar51 = pvVar45;
          pvVar54 = pvVar31;
          for (uVar53 = 0; (long)(uVar53 | 7) < (long)local_c0; uVar53 = uVar53 + 8) {
            lVar50 = 0;
            for (lVar56 = 0; lVar56 != 0x40; lVar56 = lVar56 + 8) {
              *(undefined2 *)(lVar43 + lVar56) = *(undefined2 *)((long)pvVar35 + lVar50);
              *(undefined2 *)(lVar43 + lVar56 + 2) = *(undefined2 *)((long)pvVar37 + lVar50);
              *(undefined2 *)(lVar43 + lVar56 + 4) = *(undefined2 *)((long)pvVar54 + lVar50);
              *(undefined2 *)(lVar43 + lVar56 + 6) = *(undefined2 *)((long)pvVar51 + lVar50);
              lVar50 = lVar50 + (long)(int)local_b8._44_4_ * local_b8._16_8_;
            }
            pvVar51 = (void *)((long)pvVar51 + lVar55);
            pvVar54 = (void *)((long)pvVar54 + lVar55);
            pvVar37 = (void *)((long)pvVar37 + lVar55);
            pvVar35 = (void *)((long)pvVar35 + lVar55);
            lVar43 = lVar43 + 0x40;
          }
          pvVar45 = (void *)((long)pvVar45 + 2);
          pvVar31 = (void *)((long)pvVar31 + 2);
          pvVar39 = (void *)((long)pvVar39 + 2);
          pvVar52 = (void *)((long)pvVar52 + 2);
        }
        pvVar44 = (void *)((long)pvVar44 + local_68);
        pvVar29 = (void *)((long)pvVar29 + local_68);
        pvVar41 = (void *)((long)pvVar41 + local_68);
        pvVar40 = (void *)((long)pvVar40 + local_68);
      }
      iVar42 = (this->weight_winograd43_data).w;
      pvVar29 = (this->weight_winograd43_data).data;
      sVar16 = (this->weight_winograd43_data).elemsize;
      sVar20 = (this->weight_winograd43_data).cstep;
      puVar36 = (undefined2 *)(local_b8._16_8_ * local_78 * uVar30 + local_b8._0_8_);
      for (; (long)uVar30 < (long)(int)uVar14; uVar30 = uVar30 + 1) {
        puVar49 = puVar36;
        for (lVar55 = 0; lVar55 != 0x24; lVar55 = lVar55 + 1) {
          lVar28 = (long)pvVar29 +
                   (long)iVar42 * sVar16 * lVar55 +
                   (ulong)(((uint)uVar30 & 3) + ((uint)(uVar30 >> 2) & 0x3fffffff)) *
                   sVar20 * sVar16;
          puVar58 = puVar49;
          for (uVar53 = 0; (long)(uVar53 | 7) < (long)local_c0; uVar53 = uVar53 + 8) {
            puVar57 = puVar58;
            for (lVar43 = 0; lVar43 != 0x10; lVar43 = lVar43 + 2) {
              *(undefined2 *)(lVar28 + lVar43) = *puVar57;
              puVar57 = (undefined2 *)((long)puVar57 + (long)(int)local_b8._44_4_ * local_b8._16_8_)
              ;
            }
            puVar58 = puVar58 + (long)(int)local_b8._44_4_ * local_b8._16_8_ * 4;
            lVar28 = lVar28 + 0x10;
          }
          puVar49 = puVar49 + 1;
        }
        puVar36 = (undefined2 *)((long)puVar36 + local_b8._16_8_ * local_78);
      }
      piVar19 = (int *)CONCAT44(local_b8._12_4_,local_b8._8_4_);
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + -1;
        UNLOCK();
        if (*piVar19 == 0) {
          if ((Allocator *)local_b8._32_8_ == (Allocator *)0x0) {
            free((void *)local_b8._0_8_);
          }
          else {
            (*(*(_func_int ***)local_b8._32_8_)[3])();
          }
        }
      }
    }
    else if (opt->use_sgemm_convolution == true) {
      convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse
                ((Mat *)(p_Var15 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_sgemm_data,num_input,
                 *(int *)(p_Var15 + 0x30 + (long)&(this->weight_winograd23_data).data),iVar42,
                 *(int *)(p_Var15 + 0x38 + (long)&(this->weight_winograd23_data).data));
    }
    else {
      convolution_transform_kernel_packed_int8_sse
                ((Mat *)(p_Var15 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_data_tm,num_input,
                 *(int *)(p_Var15 + 0x30 + (long)&(this->weight_winograd23_data).data),iVar42,
                 *(int *)(p_Var15 + 0x38 + (long)&(this->weight_winograd23_data).data),8,1);
    }
  }
  if ((bVar60 & (bVar32 ^ 1)) == 1) {
    p_Var15 = this->_vptr_Convolution_x86_avx512[-3];
    iVar42 = *(int *)(p_Var15 + 0x34 + (long)&(this->weight_winograd23_data).data);
    if (((iVar42 == 1) &&
        (*(int *)(p_Var15 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)) &&
       (((*(int *)(p_Var15 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
         (((*(int *)(p_Var15 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var15 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1)) &&
          (*(int *)(p_Var15 + (long)&(this->weight_winograd43_data).data) == 1)))) ||
        ((((*(int *)(p_Var15 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var15 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
          (*(int *)(p_Var15 + 0x44 + (long)&(this->weight_winograd23_data).data) == 2)) &&
         (*(int *)(p_Var15 + (long)&(this->weight_winograd43_data).data) == 2)))))) {
      iVar47 = *(int *)(p_Var15 + 0x30 + (long)&(this->weight_winograd23_data).data);
      iVar46 = 1;
      iVar42 = iVar46;
    }
    else {
      if ((((opt->use_winograd_convolution == true) && (iVar42 == 3)) &&
          (((opt->use_winograd23_convolution != false &&
            (((*(int *)(p_Var15 + 0x38 + (long)&(this->weight_winograd23_data).data) == 3 &&
              (*(int *)(p_Var15 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
             (*(int *)(p_Var15 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)))) &&
           ((*(int *)(p_Var15 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
            (*(int *)(p_Var15 + (long)&(this->weight_winograd43_data).data) == 1)))))) &&
         (0xf < (int)num_input)) {
        iVar46 = *(int *)(p_Var15 + 0x30 + (long)&(this->weight_winograd23_data).data);
        if (0xf < (long)iVar46) {
          Mat::create(&this->weight_winograd23_data,0x10,num_input,iVar46,2,(Allocator *)0x0);
          for (lVar55 = 0; lVar55 != iVar46; lVar55 = lVar55 + 1) {
            lVar28 = (long)(int)(num_input * 9 * (int)lVar55) +
                     *(long *)(p_Var15 + 0x30 + (long)&(this->weight_winograd63_data).data);
            iVar42 = (this->weight_winograd23_data).w;
            sVar16 = (this->weight_winograd23_data).elemsize;
            pvVar29 = (void *)(sVar16 * (this->weight_winograd23_data).cstep * lVar55 +
                              (long)(this->weight_winograd23_data).data);
            for (uVar30 = 0; pvVar26 = pvVar29, uVar30 != uVar24; uVar30 = uVar30 + 1) {
              lVar43 = uVar30 * 9;
              cVar2 = *(char *)(lVar28 + lVar43);
              cVar3 = *(char *)(lVar28 + 1 + lVar43);
              cVar4 = *(char *)(lVar28 + 2 + lVar43);
              cVar5 = *(char *)(lVar28 + 3 + lVar43);
              cVar6 = *(char *)(lVar28 + 4 + lVar43);
              cVar7 = *(char *)(lVar28 + 5 + lVar43);
              cVar8 = *(char *)(lVar28 + 6 + lVar43);
              cVar9 = *(char *)(lVar28 + 7 + lVar43);
              cVar10 = *(char *)(lVar28 + 8 + lVar43);
              for (lVar43 = 4; lVar43 != 0x1c; lVar43 = lVar43 + 6) {
                sVar11 = *(short *)(&UNK_004c726c + lVar43);
                sVar12 = *(short *)(&UNK_004c726e + lVar43);
                sVar13 = *(short *)((long)&DAT_004c7270 + lVar43);
                *(short *)((long)&local_c0 + lVar43 + 4) =
                     sVar13 * cVar4 + sVar12 * cVar3 + sVar11 * cVar2;
                *(short *)((long)&local_c0 + lVar43 + 6) =
                     sVar13 * cVar7 + sVar12 * cVar6 + sVar11 * cVar5;
                *(short *)(local_b8 + lVar43) = sVar13 * cVar10 + sVar12 * cVar9 + sVar11 * cVar8;
              }
              pvVar29 = pvVar26;
              for (lVar43 = 0; lVar43 != 4; lVar43 = lVar43 + 1) {
                sVar11 = *(short *)(local_b8 + lVar43 * 6);
                uVar14 = *(uint *)(local_b8 + lVar43 * 6 + 2);
                puVar48 = &DAT_004c7272;
                for (lVar50 = 0; lVar50 != 4; lVar50 = lVar50 + 1) {
                  auVar21 = vpmullw_avx(ZEXT416(*puVar48),ZEXT416(uVar14));
                  uVar34 = vpextrw_avx(auVar21,1);
                  *(short *)((long)pvVar29 + lVar50 * 2) =
                       (short)uVar34 + auVar21._0_2_ + *(short *)((long)puVar48 + -2) * sVar11;
                  puVar48 = (uint *)((long)puVar48 + 6);
                }
                pvVar29 = (void *)((long)pvVar29 + 8);
              }
              pvVar29 = (void *)((long)pvVar26 + (long)iVar42 * sVar16);
              local_c0 = pvVar26;
            }
          }
          goto LAB_001b2200;
        }
      }
      if (opt->use_sgemm_convolution != true) {
        if (p_Var15 != (_func_int *)0xfffffffffffffeb0) {
          piVar19 = *(int **)(p_Var15 + 0x38 + (long)&(this->weight_winograd63_data).data);
          if (piVar19 != (int *)0x0) {
            LOCK();
            *piVar19 = *piVar19 + 1;
            UNLOCK();
          }
          piVar19 = (this->weight_data_tm).refcount;
          if (piVar19 != (int *)0x0) {
            LOCK();
            *piVar19 = *piVar19 + -1;
            UNLOCK();
            if (*piVar19 == 0) {
              pAVar17 = (this->weight_data_tm).allocator;
              if (pAVar17 == (Allocator *)0x0) {
                free((this->weight_data_tm).data);
              }
              else {
                (*pAVar17->_vptr_Allocator[3])();
              }
            }
          }
          (this->weight_data_tm).cstep = 0;
          *(undefined1 (*) [16])((long)&(this->weight_data_tm).refcount + 4) = (undefined1  [16])0x0
          ;
          (this->weight_data_tm).data = (void *)0x0;
          (this->weight_data_tm).refcount = (int *)0x0;
          (this->weight_data_tm).c = 0;
          (this->weight_data_tm).dims = 0;
          (this->weight_data_tm).w = 0;
          (this->weight_data_tm).h = 0;
          (this->weight_data_tm).d = 0;
          piVar19 = *(int **)(p_Var15 + 0x30 + (long)&(this->weight_winograd63_data).data + 8);
          (this->weight_data_tm).data =
               *(void **)(p_Var15 + 0x30 + (long)&(this->weight_winograd63_data).data);
          (this->weight_data_tm).refcount = piVar19;
          (this->weight_data_tm).elemsize =
               *(size_t *)(p_Var15 + 0x40 + (long)&(this->weight_winograd63_data).data);
          (this->weight_data_tm).elempack =
               *(int *)((long)&this->convolution_dilation1 + (long)p_Var15);
          (this->weight_data_tm).allocator =
               *(Allocator **)(p_Var15 + (long)&(this->scale_in_data).data);
          uVar22 = *(undefined8 *)(p_Var15 + 8 + (long)&(this->scale_in_data).data);
          uVar23 = *(undefined8 *)(p_Var15 + 8 + (long)&(this->scale_in_data).data + 8);
          (this->weight_data_tm).dims = (int)uVar22;
          (this->weight_data_tm).w = (int)((ulong)uVar22 >> 0x20);
          (this->weight_data_tm).h = (int)uVar23;
          (this->weight_data_tm).d = (int)((ulong)uVar23 >> 0x20);
          (this->weight_data_tm).c = *(int *)(p_Var15 + 0x18 + (long)&(this->scale_in_data).data);
          (this->weight_data_tm).cstep =
               *(size_t *)(p_Var15 + 0x20 + (long)&(this->scale_in_data).data);
        }
        goto LAB_001b2200;
      }
      iVar47 = *(int *)(p_Var15 + 0x30 + (long)&(this->weight_winograd23_data).data);
      iVar46 = *(int *)(p_Var15 + 0x38 + (long)&(this->weight_winograd23_data).data);
    }
    convolution_im2col_sgemm_transform_kernel_int8_sse
              ((Mat *)(p_Var15 + 0x30 + (long)&(this->weight_winograd63_data).data),
               &this->weight_sgemm_data,num_input,iVar47,iVar42,iVar46);
  }
LAB_001b2200:
  Mat::create(&this->scale_in_data,
              *(int *)(this->_vptr_Convolution_x86_avx512[-3] + 0x30 +
                      (long)&(this->weight_winograd23_data).data),4,(Allocator *)0x0);
  pp_Var18 = this->_vptr_Convolution_x86_avx512;
  pvVar29 = (this->scale_in_data).data;
  for (lVar55 = 0; p_Var15 = pp_Var18[-3],
      lVar55 < *(int *)(p_Var15 + 0x30 + (long)&(this->weight_winograd23_data).data);
      lVar55 = lVar55 + 1) {
    fVar1 = *(float *)(*(long *)(&this->field_0x1f0 + (long)p_Var15) + lVar55 * 4);
    fVar61 = 0.0;
    if (fVar1 != 0.0) {
      fVar61 = 1.0 / (fVar1 * **(float **)(&this->field_0x238 + (long)p_Var15));
    }
    *(float *)((long)pvVar29 + lVar55 * 4) = fVar61;
  }
  if (opt->lightmode != false) {
    piVar19 = *(int **)(p_Var15 + 0x38 + (long)&(this->weight_winograd63_data).data);
    if (piVar19 != (int *)0x0) {
      LOCK();
      *piVar19 = *piVar19 + -1;
      UNLOCK();
      if (*piVar19 == 0) {
        if (*(long **)(p_Var15 + (long)&(this->scale_in_data).data) == (long *)0x0) {
          free(*(void **)(p_Var15 + 0x30 + (long)&(this->weight_winograd63_data).data));
        }
        else {
          (**(code **)(**(long **)(p_Var15 + (long)&(this->scale_in_data).data) + 0x18))();
        }
      }
    }
    *(undefined8 *)(p_Var15 + 0x20 + (long)&(this->scale_in_data).data) = 0;
    *(undefined8 *)(p_Var15 + 0x3c + (long)&(this->weight_winograd63_data).data) = 0;
    *(undefined8 *)(p_Var15 + 0x44 + (long)&(this->weight_winograd63_data).data) = 0;
    *(undefined8 *)(p_Var15 + 0x30 + (long)&(this->weight_winograd63_data).data) = 0;
    *(undefined8 *)(p_Var15 + 0x38 + (long)&(this->weight_winograd63_data).data) = 0;
    *(undefined8 *)(p_Var15 + 8 + (long)&(this->scale_in_data).data) = 0;
    *(undefined8 *)(p_Var15 + 0x10 + (long)&(this->scale_in_data).data) = 0;
    *(undefined4 *)(p_Var15 + 0x18 + (long)&(this->scale_in_data).data) = 0;
  }
  return 0;
}

Assistant:

int Convolution_x86_avx512::create_pipeline_int8_x86(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    const int num_input = weight_data_size / maxk / num_output;

    int elempack = 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        elempack = num_input % 8 == 0 ? 8 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

#if __SSE2__
    if (elempack == 8 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_int8_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 7 && kernel_h == 7 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_int8_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_int8_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd23_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && num_input >= 16 && num_output >= 16)
        {
            conv3x3s1_winograd23_transform_kernel_int8_sse(weight_data, weight_winograd23_data, num_input, num_output, opt);
            // conv3x3s1_winograd43_transform_kernel_int8_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            weight_data_tm = weight_data;
        }
    }

    scale_in_data.create(num_output);
    for (int p = 0; p < num_output; p++)
    {
        // requantize and relu
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        scale_in_data[p] = scale_in;
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}